

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int h264_macroblock_layer
              (bitstream *str,h264_cabac_context *cabac,h264_slice *slice,h264_macroblock *mb)

{
  h264_picparm *phVar1;
  h264_seqparm *phVar2;
  bool bVar3;
  int iVar4;
  bool local_55;
  uint32_t local_54;
  int infer_cbp;
  int has_chroma;
  int i_1;
  int noSubMbPartSizeLessThan8x8Flag;
  int i;
  h264_seqparm *seqparm;
  h264_picparm *picparm;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  phVar1 = slice->picparm;
  phVar2 = slice->seqparm;
  iVar4 = h264_mb_type(str,cabac,slice->slice_type,&mb->mb_type);
  if (iVar4 != 0) {
    return 1;
  }
  if (mb->mb_type == 0x19) {
    iVar4 = vs_align_byte(str,VS_ALIGN_0);
    if (iVar4 != 0) {
      return 1;
    }
    for (i_1 = 0; i_1 < 0x100; i_1 = i_1 + 1) {
      iVar4 = vs_u(str,mb->pcm_sample_luma + i_1,slice->bit_depth_luma_minus8 + 8);
      if (iVar4 != 0) {
        return 1;
      }
    }
    if (slice->chroma_array_type != 0) {
      for (i_1 = 0; i_1 < 0x40 << ((byte)slice->chroma_array_type & 0x1f); i_1 = i_1 + 1) {
        iVar4 = vs_u(str,mb->pcm_sample_chroma + i_1,slice->bit_depth_chroma_minus8 + 8);
        if (iVar4 != 0) {
          return 1;
        }
      }
    }
    if ((cabac != (h264_cabac_context *)0x0) &&
       (iVar4 = h264_cabac_init_arith(str,cabac), iVar4 != 0)) {
      return 1;
    }
    iVar4 = vs_infers(str,&mb->mb_qp_delta,0);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = vs_infer(str,&mb->coded_block_pattern,0x2f);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = infer_intra(str,mb,0);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = infer_intra(str,mb,1);
    if (iVar4 != 0) {
      return 1;
    }
    for (i_1 = 0; i_1 < 0x11; i_1 = i_1 + 1) {
      mb->coded_block_flag[0][i_1] = 1;
      mb->coded_block_flag[1][i_1] = 1;
      mb->coded_block_flag[2][i_1] = 1;
    }
    for (i_1 = 0; i_1 < 0x10; i_1 = i_1 + 1) {
      mb->total_coeff[0][i_1] = 0x10;
      mb->total_coeff[1][i_1] = 0x10;
      *(int *)((long)(mb->coded_block_flag + -1) + ((long)i_1 + 1) * 4) = 0x10;
    }
  }
  else {
    bVar3 = true;
    iVar4 = h264_is_submb_mb_type(mb->mb_type);
    if (iVar4 == 0) {
      if ((mb->mb_type == 0) || (mb->mb_type == 0x1a)) {
        if (phVar1->transform_8x8_mode_flag == 0) {
          iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0);
          if (iVar4 != 0) {
            return 1;
          }
        }
        else {
          iVar4 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
          if (iVar4 != 0) {
            return 1;
          }
        }
      }
      iVar4 = h264_mb_pred(str,cabac,slice,mb);
      if (iVar4 != 0) {
        return 1;
      }
    }
    else {
      iVar4 = h264_sub_mb_pred(str,cabac,slice,mb);
      if (iVar4 != 0) {
        return 1;
      }
      for (infer_cbp = 0; infer_cbp < 4; infer_cbp = infer_cbp + 1) {
        if (mb->sub_mb_type[infer_cbp] == 4) {
          if (phVar2->direct_8x8_inference_flag == 0) {
            bVar3 = false;
          }
        }
        else if (sub_mb_part_info[mb->sub_mb_type[infer_cbp]][0] != 0) {
          bVar3 = false;
        }
      }
      iVar4 = vs_infer(str,&mb->intra_chroma_pred_mode,0);
      if (iVar4 != 0) {
        return 1;
      }
    }
    if (((mb->mb_type == 0) || (mb->mb_type == 0x1a)) || (0x19 < mb->mb_type)) {
      local_55 = false;
      if (slice->chroma_array_type < 3) {
        local_55 = slice->chroma_array_type != 0;
      }
      iVar4 = h264_coded_block_pattern
                        (str,cabac,mb->mb_type,(uint)local_55,&mb->coded_block_pattern);
      if (iVar4 != 0) {
        return 1;
      }
      if (0x19 < mb->mb_type) {
        if ((((mb->coded_block_pattern & 0xf) == 0) || (phVar1->transform_8x8_mode_flag == 0)) ||
           ((!bVar3 || ((mb->mb_type == 0x21 && (phVar2->direct_8x8_inference_flag == 0)))))) {
          iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0);
          if (iVar4 != 0) {
            return 1;
          }
        }
        else {
          iVar4 = h264_transform_size_8x8_flag(str,cabac,&mb->transform_size_8x8_flag);
          if (iVar4 != 0) {
            return 1;
          }
        }
      }
    }
    else {
      local_54 = (mb->mb_type - 1 >> 2) % 3 << 4;
      if (0xc < mb->mb_type) {
        local_54 = local_54 | 0xf;
      }
      iVar4 = vs_infer(str,&mb->coded_block_pattern,local_54);
      if (iVar4 != 0) {
        return 1;
      }
      iVar4 = vs_infer(str,&mb->transform_size_8x8_flag,0);
      if (iVar4 != 0) {
        return 1;
      }
    }
    if ((mb->coded_block_pattern == 0) &&
       (iVar4 = h264_is_intra_16x16_mb_type(mb->mb_type), iVar4 == 0)) {
      iVar4 = vs_infers(str,&mb->mb_qp_delta,0);
      if (iVar4 != 0) {
        return 1;
      }
    }
    else {
      iVar4 = h264_mb_qp_delta(str,cabac,&mb->mb_qp_delta);
      if (iVar4 != 0) {
        return 1;
      }
    }
    iVar4 = h264_residual(str,cabac,slice,mb,0,0xf);
    if (iVar4 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_macroblock_layer(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb) {
	struct h264_picparm *picparm = slice->picparm;
	struct h264_seqparm *seqparm = slice->seqparm;
	if (h264_mb_type(str, cabac, slice->slice_type, &mb->mb_type)) return 1;
	if (mb->mb_type == H264_MB_TYPE_I_PCM) {
		if (vs_align_byte(str, VS_ALIGN_0)) return 1;
		int i;
		for (i = 0; i < 256; i++)
			if (vs_u(str, &mb->pcm_sample_luma[i], slice->bit_depth_luma_minus8 + 8)) return 1;
		if (slice->chroma_array_type) {
			for (i = 0; i < (64 << slice->chroma_array_type); i++)
				if (vs_u(str, &mb->pcm_sample_chroma[i], slice->bit_depth_chroma_minus8 + 8)) return 1;
		}
		if (cabac)
			if (h264_cabac_init_arith(str, cabac)) return 1;
		if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		if (vs_infer(str, &mb->coded_block_pattern, 0x2f)) return 1;
		if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		if (infer_intra(str, mb, 0)) return 1;
		if (infer_intra(str, mb, 1)) return 1;
		for (i = 0; i < 17; i++) {
			mb->coded_block_flag[0][i] = 1;
			mb->coded_block_flag[1][i] = 1;
			mb->coded_block_flag[2][i] = 1;
		}
		for (i = 0; i < 16; i++) {
			mb->total_coeff[0][i] = 16;
			mb->total_coeff[1][i] = 16;
			mb->total_coeff[2][i] = 16;
		}
	} else {
		int noSubMbPartSizeLessThan8x8Flag = 1;
		if (h264_is_submb_mb_type(mb->mb_type)) {
			if (h264_sub_mb_pred(str, cabac, slice, mb)) return 1;
			int i;
			for (i = 0; i < 4; i++) {
				if (mb->sub_mb_type[i] != H264_SUB_MB_TYPE_B_DIRECT_8X8) {
					if (sub_mb_part_info[mb->sub_mb_type[i]][0])
						noSubMbPartSizeLessThan8x8Flag = 0;
				} else {
					if (!seqparm->direct_8x8_inference_flag)
						noSubMbPartSizeLessThan8x8Flag = 0;
				}
			}
			if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
		} else {
			if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI) {
				if (picparm->transform_8x8_mode_flag) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
			if (h264_mb_pred(str, cabac, slice, mb)) return 1;
		}
		if (mb->mb_type == H264_MB_TYPE_I_NXN || mb->mb_type == H264_MB_TYPE_SI || mb->mb_type >= H264_MB_TYPE_I_END) {
			int has_chroma = slice->chroma_array_type < 3 && slice->chroma_array_type != 0;
			if (h264_coded_block_pattern(str, cabac, mb->mb_type, has_chroma, &mb->coded_block_pattern)) return 1;
			if (mb->mb_type >= H264_MB_TYPE_I_END) {
				if ((mb->coded_block_pattern & 0xf) && picparm->transform_8x8_mode_flag && noSubMbPartSizeLessThan8x8Flag && (mb->mb_type != H264_MB_TYPE_B_DIRECT_16X16 || seqparm->direct_8x8_inference_flag)) {
					if (h264_transform_size_8x8_flag(str, cabac, &mb->transform_size_8x8_flag)) return 1;
				} else {
					if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
				}
			}
		} else {
			int infer_cbp = (((mb->mb_type - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
			if (mb->mb_type >= H264_MB_TYPE_I_16X16_0_0_1)
				infer_cbp |= 0xf;
			if (vs_infer(str, &mb->coded_block_pattern, infer_cbp)) return 1;
			if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
		}
		if (mb->coded_block_pattern || h264_is_intra_16x16_mb_type(mb->mb_type)) {
			if (h264_mb_qp_delta(str, cabac, &mb->mb_qp_delta)) return 1;
		} else {
			if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
		}
		if (h264_residual(str, cabac, slice, mb, 0, 15)) return 1;
	}
	return 0;
}